

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_after_none
                (ExtPartController *ext_part_controller,int is_intra_frame,
                float *features_after_none,int *do_square_split,int *do_rectangular_split)

{
  _Bool _Var1;
  undefined4 *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined4 *in_R8;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  int i;
  aom_partition_features_t features;
  aom_partition_decision_t *in_stack_ffffffffffffd490;
  ExtPartController *in_stack_ffffffffffffd498;
  undefined4 local_b54;
  undefined4 local_b50;
  int local_b2c;
  undefined4 auStack_a7c [659];
  undefined4 *local_30;
  undefined4 *local_28;
  long local_20;
  _Bool local_1;
  
  if ((*in_RDI == 0) || (in_ESI != 0)) {
    local_1 = false;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    for (local_b2c = 0; local_b2c < 4; local_b2c = local_b2c + 1) {
      auStack_a7c[local_b2c] = *(undefined4 *)(local_20 + (long)local_b2c * 4);
    }
    av1_ext_part_send_features
              (in_stack_ffffffffffffd498,(aom_partition_features_t *)in_stack_ffffffffffffd490);
    _Var1 = av1_ext_part_get_partition_decision(in_stack_ffffffffffffd498,in_stack_ffffffffffffd490)
    ;
    if (_Var1) {
      *local_28 = local_b50;
      *local_30 = local_b54;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ext_ml_model_decision_after_none(
    ExtPartController *const ext_part_controller, const int is_intra_frame,
    const float *const features_after_none, int *do_square_split,
    int *do_rectangular_split) {
  if (!ext_part_controller->ready || is_intra_frame) return false;

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_AFTER_NONE;
  for (int i = 0; i < 4; ++i) {
    features.after_part_none.f[i] = features_after_none[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *do_square_split = decision.do_square_split;
  *do_rectangular_split = decision.do_rectangular_split;

  return true;
}